

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void pybind11::class_<GraphEditor>::dealloc(value_and_holder *v_h)

{
  byte *pbVar1;
  instance *piVar2;
  byte bVar3;
  error_scope scope;
  error_scope local_20;
  
  PyErr_Fetch(&local_20,&local_20.value,&local_20.trace);
  bVar3 = v_h->inst->field_0x30;
  if ((bVar3 & 2) == 0) {
    bVar3 = (v_h->inst->field_1).nonsimple.status[v_h->index];
  }
  else {
    bVar3 = bVar3 >> 2;
  }
  if ((bVar3 & 1) == 0) {
    operator_delete(*v_h->vh,v_h->type->type_size);
  }
  else {
    std::unique_ptr<GraphEditor,_std::default_delete<GraphEditor>_>::~unique_ptr
              ((unique_ptr<GraphEditor,_std::default_delete<GraphEditor>_> *)(v_h->vh + 1));
    piVar2 = v_h->inst;
    if ((piVar2->field_0x30 & 2) == 0) {
      pbVar1 = (piVar2->field_1).nonsimple.status + v_h->index;
      *pbVar1 = *pbVar1 & 0xfe;
    }
    else {
      piVar2->field_0x30 = piVar2->field_0x30 & 0xfb;
    }
  }
  *v_h->vh = (void *)0x0;
  error_scope::~error_scope(&local_20);
  return;
}

Assistant:

static void dealloc(detail::value_and_holder &v_h) {
        // We could be deallocating because we are cleaning up after a Python exception.
        // If so, the Python error indicator will be set. We need to clear that before
        // running the destructor, in case the destructor code calls more Python.
        // If we don't, the Python API will exit with an exception, and pybind11 will
        // throw error_already_set from the C++ destructor which is forbidden and triggers
        // std::terminate().
        error_scope scope;
        if (v_h.holder_constructed()) {
            v_h.holder<holder_type>().~holder_type();
            v_h.set_holder_constructed(false);
        }
        else {
            detail::call_operator_delete(v_h.value_ptr<type>(),
                v_h.type->type_size,
                v_h.type->type_align
            );
        }
        v_h.value_ptr() = nullptr;
    }